

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O1

void __thiscall OpenSketch<4U>::OpenSketch(OpenSketch<4U> *this,int num,int _HIT)

{
  ulong *puVar1;
  undefined8 *puVar2;
  int *__s;
  KV<4U> *__s_00;
  long lVar3;
  int iVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  (this->super_Abstract<4U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<4U>).name.field_2;
  (this->super_Abstract<4U>).name._M_string_length = 0;
  (this->super_Abstract<4U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<4U>).sep.field_2
  ;
  (this->super_Abstract<4U>).sep._M_string_length = 0;
  (this->super_Abstract<4U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00112cb8;
  (this->mp)._M_h._M_buckets = &(this->mp)._M_h._M_single_bucket;
  (this->mp)._M_h._M_bucket_count = 1;
  auVar6 = ZEXT416(0) << 0x40;
  (this->mp)._M_h._M_before_begin = (__node_base)auVar6._0_8_;
  (this->mp)._M_h._M_element_count = auVar6._8_8_;
  (this->mp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->mp)._M_h._M_rehash_policy._M_next_resize = auVar6;
  (this->super_Abstract<4U>).HIT = _HIT;
  *(undefined4 *)&(this->super_Abstract<4U>).field_0x6c = 0x80;
  this->CAPACITY = 0xfa;
  this->heap_num = 0;
  uVar5 = ((long)num - 12000U) / 0x14;
  iVar4 = (int)uVar5;
  this->COLUMN = iVar4;
  lVar3 = uVar5 << 0x20;
  uVar5 = (ulong)iVar4;
  puVar1 = (ulong *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | lVar3 >> 0x1c | 8);
  *puVar1 = uVar5;
  if (lVar3 != 0) {
    lVar3 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar3 + 8) = 0x80;
      puVar2 = (undefined8 *)operator_new__(0x11);
      *(undefined8 **)((long)puVar1 + lVar3 + 0x10) = puVar2;
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined1 *)(puVar2 + 2) = 0;
      lVar3 = lVar3 + 0x10;
    } while (uVar5 * 0x10 != lVar3);
  }
  this->bitset = (BitSet *)(puVar1 + 1);
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar5 = (long)iVar4 << 2;
  }
  __s = (int *)operator_new__(uVar5);
  this->counter = __s;
  memset(__s,0,(long)iVar4 << 2);
  __s_00 = (KV<4U> *)operator_new__(2000);
  memset(__s_00,0,2000);
  this->heap = __s_00;
  memset(__s_00,0,2000);
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<4U>).sep,0,
             (char *)(this->super_Abstract<4U>).sep._M_string_length,0x10d863);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<4U>).name,0,
             (char *)(this->super_Abstract<4U>).name._M_string_length,0x10d86a);
  return;
}

Assistant:

OpenSketch(int num, int _HIT) {
		this->HIT = _HIT;
		LENGTH = 128;
		CAPACITY = 250;
		COLUMN = (num - 6 * CAPACITY * sizeof(KV<DATA_LEN>)) / 20;
		heap_num = 0;
		bitset = new BitSet[COLUMN];
		counter = new int[COLUMN];
		memset(counter, 0, sizeof(int) * COLUMN);
		heap = new KV<DATA_LEN>[CAPACITY];
		memset(heap, 0, sizeof(KV<DATA_LEN>) * CAPACITY);
		this->aae = this->are = this->pr = this->cr = 0;
		this->sep = "\t\t";
		this->name = "OpenSketch";
	}